

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

pair<int,_int> *
frozen::bits::partition<std::pair<int,int>*,frozen::impl::CompareKey<std::less<int>>>
          (pair<int,_int> *left,pair<int,_int> *right,CompareKey<std::less<int>_> *compare)

{
  undefined1 auVar1 [16];
  int iVar2;
  pair<int,_int> *local_30;
  pair<int,_int> *it;
  pair<int,_int> *pivot;
  CompareKey<std::less<int>_> *compare_local;
  pair<int,_int> *right_local;
  pair<int,_int> *left_local;
  
  auVar1._8_8_ = (long)right - (long)left >> 0x3f;
  auVar1._0_8_ = (long)right - (long)left >> 3;
  iter_swap<std::pair<int,int>*>(right,left + SUB168(auVar1 / SEXT816(2),0));
  right_local = left;
  for (local_30 = left; 0 < (long)right - (long)local_30 >> 3; local_30 = local_30 + 1) {
    iVar2 = impl::CompareKey<std::less<int>>::operator()(compare,local_30,right);
    if (iVar2 != 0) {
      iter_swap<std::pair<int,int>*>(local_30,right_local);
      right_local = right_local + 1;
    }
  }
  iter_swap<std::pair<int,int>*>(right,right_local);
  return right_local;
}

Assistant:

constexpr Iterator partition(Iterator left, Iterator right, Compare const &compare) {
  auto pivot = left + (right - left) / 2;
  iter_swap(right, pivot);
  pivot = right;
  for (auto it = left; 0 < right - it; ++it) {
    if (compare(*it, *pivot)) {
      iter_swap(it, left);
      left++;
    }
  }
  iter_swap(pivot, left);
  pivot = left;
  return pivot;
}